

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall Clasp::Solver::ccResolve(Solver *this,LitVec *cc,uint32 pos,LitVec *reason)

{
  size_type *psVar1;
  pointer pDVar2;
  uint *puVar3;
  uint uVar4;
  pointer pLVar5;
  pointer puVar6;
  size_type sVar7;
  ulong in_RAX;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  undefined8 uStack_38;
  
  plVar10 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  uStack_38 = in_RAX;
  (**(code **)(*plVar10 + 0x50))(plVar10,this,reason,(cc->ebo_).buf[pos].rep_);
  sVar7 = (reason->ebo_).size;
  if (sVar7 != 0) {
    uVar9 = 0;
    do {
      uVar8 = (reason->ebo_).buf[uVar9].rep_;
      uVar4 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar8 & 0xfffffffc));
      if ((uVar4 & 0xc) == 0) {
        pDVar2 = (this->levels_).super_type.ebo_.buf + ((uVar4 >> 4) - 1);
        *(uint *)pDVar2 = *(uint *)pDVar2 | 0x40000000;
        uStack_38 = CONCAT44(uVar8,(undefined4)uStack_38) & 0xfffffffeffffffff ^ 0x200000000;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (cc,(Literal *)((long)&uStack_38 + 4));
        sVar7 = (reason->ebo_).size;
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != sVar7);
  }
  pLVar5 = (cc->ebo_).buf;
  puVar6 = (this->assign_).assign_.ebo_.buf;
  puVar3 = (uint *)((long)puVar6 + (ulong)(pLVar5[pos].rep_ & 0xfffffffc));
  *puVar3 = *puVar3 & 0xfffffff3;
  pDVar2 = (this->levels_).super_type.ebo_.buf +
           ((*(uint *)((long)puVar6 + (ulong)(pLVar5[pos].rep_ & 0xfffffffc)) >> 4) - 1);
  *(uint *)pDVar2 = *(uint *)pDVar2 & 0xbfffffff;
  pLVar5 = (cc->ebo_).buf;
  pLVar5[pos].rep_ = pLVar5[(cc->ebo_).size - 1].rep_;
  psVar1 = &(cc->ebo_).size;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void Solver::ccResolve(LitVec& cc, uint32 pos, const LitVec& reason) {
	heuristic_->updateReason(*this, reason, cc[pos]);
	Literal x;
	for (LitVec::size_type i = 0; i != reason.size(); ++i) {
		x = reason[i];
		assert(isTrue(x));
		if (!seen(x.var())) {
			markLevel(level(x.var()));
			cc.push_back(~x);
		}
	}
	clearSeen(cc[pos].var());
	unmarkLevel(level(cc[pos].var()));
	cc[pos] = cc.back();
	cc.pop_back();
}